

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::learntLenBumpActivity(SAT *this,int l)

{
  double *pdVar1;
  long lVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  
  if (l < 0x200) {
    if (((byte)engine.conflicts & 0xf) == 0) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      dVar4 = exp(((double)((lVar2 - (this->ll_time).__d.__r) / 1000000) / 1000.0) /
                  this->learnt_len_el);
      dVar5 = this->ll_inc * dVar4;
      this->ll_inc = dVar5;
      if (1e+100 < dVar5) {
        pdVar1 = (this->learnt_len_occ).data;
        for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
          pdVar1[lVar3] = pdVar1[lVar3] * 1e-100;
        }
        dVar5 = this->ll_inc * 1e-100;
        this->ll_inc = dVar5;
      }
      (this->ll_time).__d.__r = lVar2;
      this->confl_rate = this->confl_rate / dVar4;
    }
    else {
      dVar5 = this->ll_inc;
    }
    pdVar1 = (this->learnt_len_occ).data;
    pdVar1[(uint)l] = dVar5 + pdVar1[(uint)l];
    this->confl_rate = 1.0 / this->learnt_len_el + this->confl_rate;
  }
  return;
}

Assistant:

inline void SAT::learntLenBumpActivity(int l) {
	if (l >= MAX_SHARE_LEN) {
		return;
	}
	if (engine.conflicts % 16 == 0) {
		const time_point new_ll_time = chuffed_clock::now();
		auto diff = std::chrono::duration_cast<duration>(new_ll_time - ll_time);
		const double factor = exp(to_sec(diff) / learnt_len_el);
		ll_inc *= factor;
		if (ll_inc > 1e100) {
			for (int i = 0; i < MAX_SHARE_LEN; i++) {
				learnt_len_occ[i] *= 1e-100;
			}
			ll_inc *= 1e-100;
		}
		ll_time = new_ll_time;
		confl_rate /= factor;
	}
	learnt_len_occ[l] += ll_inc;
	confl_rate += 1 / learnt_len_el;
}